

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O0

bool __thiscall avro::Validator::getNextFieldName(Validator *this,string *name)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  type pNVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *in_RSI;
  long in_RDI;
  NodePtr *node;
  size_t pos;
  int idx;
  bool found;
  int local_38;
  bool local_11;
  
  local_11 = false;
  std::__cxx11::string::clear();
  bVar1 = isCompound(*(Type *)(in_RDI + 0x10));
  if (bVar1) {
    sVar4 = std::
            vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>::
            size((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                  *)(in_RDI + 0x28));
    local_38 = (int)sVar4 + -2;
  }
  else {
    sVar4 = std::
            vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>::
            size((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                  *)(in_RDI + 0x28));
    local_38 = (int)sVar4 + -1;
  }
  if (-1 < local_38) {
    pvVar5 = std::
             vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>::
             operator[]((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                         *)(in_RDI + 0x28),(long)local_38);
    pNVar6 = boost::shared_ptr<avro::Node>::operator->(&pvVar5->node);
    TVar2 = Node::type(pNVar6);
    if (TVar2 == AVRO_RECORD) {
      pvVar5 = std::
               vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
               ::operator[]((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                             *)(in_RDI + 0x28),(long)local_38);
      uVar7 = pvVar5->pos - 1;
      pvVar5 = std::
               vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
               ::operator[]((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                             *)(in_RDI + 0x28),(long)local_38);
      pNVar6 = boost::shared_ptr<avro::Node>::operator->(&pvVar5->node);
      iVar3 = (*pNVar6->_vptr_Node[4])();
      local_11 = uVar7 < CONCAT44(extraout_var,iVar3);
      if (local_11) {
        pNVar6 = boost::shared_ptr<avro::Node>::operator->(&pvVar5->node);
        iVar3 = (*pNVar6->_vptr_Node[8])(pNVar6,uVar7 & 0xffffffff);
        std::__cxx11::string::operator=(in_RSI,(string *)CONCAT44(extraout_var_00,iVar3));
      }
    }
  }
  return local_11;
}

Assistant:

bool 
Validator::getNextFieldName(std::string &name) const
{
    bool found = false;
    name.clear();
    int idx = isCompound(nextType_) ? compoundStack_.size()-2 : compoundStack_.size()-1;
    if(idx >= 0 && compoundStack_[idx].node->type() == AVRO_RECORD) {
        size_t pos = compoundStack_[idx].pos-1;
        const NodePtr &node = compoundStack_[idx].node;
        if(pos < node->leaves()) {
            name = node->nameAt(pos);
            found = true;
        }
    }
    return found;
}